

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O3

void __thiscall cmCTestSubmitHandler::cmCTestSubmitHandler(cmCTestSubmitHandler *this)

{
  _Rb_tree_header *p_Var1;
  
  cmCTestGenericHandler::cmCTestGenericHandler(&this->super_cmCTestGenericHandler);
  (this->super_cmCTestGenericHandler).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCTestSubmitHandler_006b6028;
  (this->HTTPProxy)._M_dataplus._M_p = (pointer)&(this->HTTPProxy).field_2;
  (this->HTTPProxy)._M_string_length = 0;
  (this->HTTPProxy).field_2._M_local_buf[0] = '\0';
  (this->HTTPProxyAuth)._M_dataplus._M_p = (pointer)&(this->HTTPProxyAuth).field_2;
  (this->HTTPProxyAuth)._M_string_length = 0;
  (this->HTTPProxyAuth).field_2._M_local_buf[0] = '\0';
  (this->FTPProxy)._M_dataplus._M_p = (pointer)&(this->FTPProxy).field_2;
  (this->FTPProxy)._M_string_length = 0;
  (this->FTPProxy).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->Files)._M_t._M_impl.super__Rb_tree_header;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Initialize(this);
  return;
}

Assistant:

cmCTestSubmitHandler::cmCTestSubmitHandler() : HTTPProxy(), FTPProxy()
{
  this->Initialize();
}